

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

double __thiscall ChebTools::ChebyshevExpansion::monotonic_solvex(ChebyshevExpansion *this,double y)

{
  int iVar1;
  long lVar2;
  invalid_argument *this_00;
  char *__function;
  ulong uVar3;
  Scalar SVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double *pdVar8;
  VectorXd ynodes;
  VectorXd nodes;
  anon_class_72_2_9474d211 secant;
  scalar_max_op<double,_double,_0> local_d9;
  undefined1 local_d8 [24];
  double local_c0;
  double *local_b8;
  Index IStack_b0;
  double local_a0;
  double local_98;
  undefined8 uStack_90;
  double local_80;
  plainobjectbase_evaluator_data<double,_0> local_78;
  ChebyshevExpansion local_70;
  double *local_30;
  double local_28;
  Index IStack_20;
  
  local_b8 = (double *)y;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&local_70,
             (DenseStorage<double,__1,__1,_1,_0> *)this);
  local_70.m_xmin = this->m_xmin;
  local_70.m_xmax = this->m_xmax;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&local_70.m_recurrence_buffer,
             (DenseStorage<double,__1,__1,_1,_0> *)&this->m_recurrence_buffer);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&local_70.m_nodal_value_cache,
             (DenseStorage<double,__1,__1,_1,_0> *)&this->m_nodal_value_cache);
  local_30 = local_b8;
  get_node_function_values((ChebyshevExpansion *)local_d8);
  get_nodes_n11((ChebyshevExpansion *)(local_d8 + 0x10));
  if ((long)local_d8._8_8_ < 1) {
    __function = 
    "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::redux(const Func &) const [Derived = Eigen::Matrix<double, -1, 1>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
    ;
LAB_001083e5:
    __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Redux.h"
                  ,0x19b,__function);
  }
  local_78.data = (double *)local_d8._0_8_;
  local_98 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
             ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_78,
                        &local_d9,(Matrix<double,__1,_1,_0,__1,_1> *)local_d8);
  if ((long)local_d8._8_8_ < 1) {
    __function = 
    "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::redux(const Func &) const [Derived = Eigen::Matrix<double, -1, 1>, BinaryOp = Eigen::internal::scalar_min_op<double>]"
    ;
    goto LAB_001083e5;
  }
  local_78.data = (double *)local_d8._0_8_;
  SVar4 = Eigen::internal::
          redux_impl<Eigen::internal::scalar_min_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
          ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                    ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_78,
                     (scalar_min_op<double,_double,_0> *)&local_d9,
                     (Matrix<double,__1,_1,_0,__1,_1> *)local_d8);
  if ((long)local_d8._8_8_ < 1) {
LAB_0010837b:
    __assert_fail("index >= 0 && index < size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0x19a,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  dVar7 = (local_98 - SVar4) * 1e-14;
  dVar5 = *(double *)local_d8._0_8_;
  if (dVar7 <= ABS(dVar5 - (double)local_b8)) {
    dVar6 = *(double *)(local_d8._0_8_ + (local_d8._8_8_ - 1) * 8);
    if (dVar7 <= ABS(dVar6 - (double)local_b8)) {
      if (dVar6 <= dVar5) {
        if ((double)local_b8 < dVar6) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (this_00,"Argument is outside the range of the expansion");
          goto LAB_00108465;
        }
        if (dVar5 < (double)local_b8) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (this_00,"Argument is outside the range of the expansion");
          goto LAB_00108465;
        }
        iVar1 = get_decreasingleftofval<Eigen::Matrix<double,_1,1,0,_1,1>>
                          ((Matrix<double,__1,_1,_0,__1,_1> *)local_d8,(double)local_b8,
                           (int)local_d8._8_8_);
      }
      else {
        if (dVar6 < (double)local_b8) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (this_00,"Argument is outside the range of the expansion");
LAB_00108465:
          __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        if ((double)local_b8 < dVar5) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (this_00,"Argument is outside the range of the expansion");
          goto LAB_00108465;
        }
        iVar1 = get_increasingleftofval<Eigen::Matrix<double,_1,1,0,_1,1>>
                          ((Matrix<double,__1,_1,_0,__1,_1> *)local_d8,(double)local_b8,
                           (int)local_d8._8_8_);
      }
      if (iVar1 < 0) {
LAB_0010839a:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      lVar2 = (long)iVar1;
      if (((((long)local_c0 <= lVar2) || ((long)local_d8._8_8_ <= lVar2)) ||
          ((ulong)local_c0 <= lVar2 + 1U)) || ((ulong)local_d8._8_8_ <= lVar2 + 1U))
      goto LAB_0010839a;
      dVar5 = *(double *)(local_d8._16_8_ + lVar2 * 8);
      dVar7 = *(double *)(local_d8._0_8_ + lVar2 * 8) - (double)local_b8;
      uStack_90 = 0;
      pdVar8 = *(double **)(local_d8._16_8_ + (lVar2 + 1) * 8);
      IStack_20 = 0;
      local_a0 = *(double *)(local_d8._0_8_ + (lVar2 + 1) * 8) - (double)local_b8;
      iVar1 = 0x32;
      do {
        local_28 = (double)pdVar8 - (((double)pdVar8 - dVar5) * local_a0) / (local_a0 - dVar7);
        local_b8 = pdVar8;
        IStack_b0 = IStack_20;
        local_98 = dVar7;
        local_80 = dVar5;
        dVar7 = y_Clenshaw_xscaled(&local_70,local_28);
        dVar7 = dVar7 - (double)local_30;
        dVar6 = local_98 * dVar7;
        dVar5 = local_28;
        if (dVar6 <= 0.0) {
          dVar5 = local_80;
        }
        uVar3 = -(ulong)(0.0 < dVar6);
        pdVar8 = (double *)((ulong)local_b8 & uVar3 | ~uVar3 & (ulong)local_28);
        if ((ABS((double)pdVar8 - dVar5) < 1e-14) || (ABS(dVar7) < 1e-14)) break;
        if (dVar6 <= 0.0) {
          local_a0 = dVar7;
        }
        dVar7 = (double)(~uVar3 & (ulong)local_98 | (ulong)dVar7 & uVar3);
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
      dVar5 = (this->m_xmax - this->m_xmin) * local_28 + this->m_xmax + this->m_xmin;
      goto LAB_00108328;
    }
    if ((long)local_c0 < (long)local_d8._8_8_) goto LAB_0010837b;
    dVar7 = this->m_xmax + this->m_xmin;
    dVar5 = (this->m_xmax - this->m_xmin) * *(double *)(local_d8._16_8_ + (local_d8._8_8_ - 1) * 8);
  }
  else {
    if ((long)local_c0 < 1) goto LAB_0010837b;
    dVar7 = this->m_xmax + this->m_xmin;
    dVar5 = (this->m_xmax - this->m_xmin) * *(double *)local_d8._16_8_;
  }
  dVar5 = dVar5 + dVar7;
LAB_00108328:
  local_b8 = (double *)(dVar5 * 0.5);
  free((void *)local_d8._16_8_);
  free((void *)local_d8._0_8_);
  free(local_70.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free(local_70.m_recurrence_buffer.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free(local_70.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
  ;
  return (double)local_b8;
}

Assistant:

double ChebyshevExpansion::monotonic_solvex(double y) const {
        /*
        Function is known to be monotonic, so we can shortcut some of the solving steps used
        We don't use the eigenvalue method because it is too slow
        */
        auto& e = *this;
        auto secant = [e,y](double a, double ya, double b, double yb, double yeps = 1e-14, double xeps = 1e-14) {
            double c, yc;
            for (auto i = 0; i < 50; ++i) {
                c = b - yb * (b - a) / (yb - ya);
                yc = e.y_Clenshaw_xscaled(c)-y;
                if (yc * ya > 0) {
                    a = c; ya = yc;
                }
                else {
                    b = c; yb = yc;
                }
                if (std::abs(b - a) < xeps) { break; }
                if (std::abs(yc) < yeps) { break; }
            }
            return c;
        };
        // Determine if the function is monotonically increasing or decreasing
        auto ynodes = get_node_function_values();
        auto nodes = get_nodes_n11();

        // Check if the input is equal to (to within numerical precision) an endpoint
        auto ytol = 1e-14 * (ynodes.maxCoeff() - ynodes.minCoeff());
        if (std::abs(ynodes[0] - y) < ytol)
            return unscale_x(nodes[0]);
        if (std::abs(ynodes[ynodes.size()-1] - y) < ytol)
            return unscale_x(nodes[ynodes.size() - 1]);

        bool increasing = ynodes[ynodes.size() - 1] > ynodes[0]; // Nodes go from 1 to -1 (stuck with this), but increasing says whether the value at the last *index* (x=-1) is greater than that of the first index (x=1).
        if (increasing) {
            if (y > ynodes[ynodes.size() - 1]) {
                throw std::invalid_argument("Argument is outside the range of the expansion");
            }
            if (y < ynodes[0]) {
                throw std::invalid_argument("Argument is outside the range of the expansion");
            }
        }
        else {
            if (y < ynodes[ynodes.size() - 1]) {
                throw std::invalid_argument("Argument is outside the range of the expansion");
            }
            if (y > ynodes[0]) {
                throw std::invalid_argument("Argument is outside the range of the expansion");
            }
        }

        // Interval bisection to find the Chebyshev-Lobatto nodes that bound the solution by bisection
        int N = static_cast<int>(ynodes.size());
        Eigen::Index i = (increasing) ? get_increasingleftofval(ynodes, y, N) : get_decreasingleftofval(ynodes, y, N);
        auto xscaled = secant(nodes(i), ynodes(i)-y, nodes(i + 1), ynodes(i + 1)-y);
        return unscale_x(xscaled);
    }